

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,idx_t depth,bool root_expression)

{
  bool bVar1;
  BaseExpression *this_00;
  CaseExpression *expr_00;
  CollateExpression *expr_01;
  SubqueryExpression *expr_02;
  LambdaExpression *expr_03;
  ParameterExpression *expr_04;
  BetweenExpression *expr_05;
  ConjunctionExpression *expr_06;
  LambdaRefExpression *lambda_ref;
  ConstantExpression *expr_07;
  ColumnRefExpression *col_ref_p;
  OperatorExpression *op;
  ComparisonExpression *expr_08;
  CastExpression *expr_09;
  FunctionExpression *function;
  NotImplementedException *this_01;
  idx_t extra_stack;
  StackChecker<duckdb::ExpressionBinder> stack_checker;
  string local_70;
  undefined1 local_50 [16];
  BinderException local_40;
  
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  operator*(expr);
  StackCheck((ExpressionBinder *)local_50,(ParsedExpression *)this,extra_stack);
  this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(expr)->super_BaseExpression;
  switch(this_00->expression_class) {
  case CASE:
    expr_00 = BaseExpression::Cast<duckdb::CaseExpression>(this_00);
    BindExpression(__return_storage_ptr__,this,expr_00,depth);
    break;
  case CAST:
    expr_09 = BaseExpression::Cast<duckdb::CastExpression>(this_00);
    BindExpression(__return_storage_ptr__,this,expr_09,depth);
    break;
  case COLUMN_REF:
    col_ref_p = BaseExpression::Cast<duckdb::ColumnRefExpression>(this_00);
    BindExpression(__return_storage_ptr__,this,col_ref_p,depth,root_expression);
    break;
  case COMPARISON:
    expr_08 = BaseExpression::Cast<duckdb::ComparisonExpression>(this_00);
    BindExpression(__return_storage_ptr__,this,expr_08,depth);
    break;
  case CONJUNCTION:
    expr_06 = BaseExpression::Cast<duckdb::ConjunctionExpression>(this_00);
    BindExpression(__return_storage_ptr__,this,expr_06,depth);
    break;
  case CONSTANT:
    expr_07 = BaseExpression::Cast<duckdb::ConstantExpression>(this_00);
    BindExpression(__return_storage_ptr__,this,expr_07,depth);
    break;
  default:
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Unimplemented expression class","");
    NotImplementedException::NotImplementedException(this_01,&local_70);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case FUNCTION:
    function = BaseExpression::Cast<duckdb::FunctionExpression>(this_00);
    bVar1 = IsUnnestFunction(&function->function_name);
    if (bVar1) {
      (*this->_vptr_ExpressionBinder[0xb])
                (__return_storage_ptr__,this,function,depth,(ulong)root_expression);
    }
    else {
      BindExpression(__return_storage_ptr__,this,function,depth,expr);
    }
    break;
  case OPERATOR:
    op = BaseExpression::Cast<duckdb::OperatorExpression>(this_00);
    BindExpression(__return_storage_ptr__,this,op,depth);
    break;
  case STAR:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"STAR expression is not supported here","");
    BinderException::Unsupported(&local_40,(ParsedExpression *)this_00,&local_70);
    BindResult::BindResult(__return_storage_ptr__,&local_40.super_Exception);
    ::std::runtime_error::~runtime_error((runtime_error *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    break;
  case SUBQUERY:
    expr_02 = BaseExpression::Cast<duckdb::SubqueryExpression>(this_00);
    BindExpression(__return_storage_ptr__,this,expr_02,depth);
    break;
  case PARAMETER:
    expr_04 = BaseExpression::Cast<duckdb::ParameterExpression>(this_00);
    BindExpression(__return_storage_ptr__,this,expr_04,depth);
    break;
  case COLLATE:
    expr_01 = BaseExpression::Cast<duckdb::CollateExpression>(this_00);
    BindExpression(__return_storage_ptr__,this,expr_01,depth);
    break;
  case LAMBDA:
    expr_03 = BaseExpression::Cast<duckdb::LambdaExpression>(this_00);
    LogicalType::LogicalType((LogicalType *)&local_70,INVALID);
    BindExpression(__return_storage_ptr__,this,expr_03,depth,(LogicalType *)&local_70,
                   (optional_ptr<duckdb::LogicalType_(*)(unsigned_long,_const_duckdb::LogicalType_&),_true>
                    )0x0);
    LogicalType::~LogicalType((LogicalType *)&local_70);
    break;
  case POSITIONAL_REFERENCE:
    BindPositionalReference(__return_storage_ptr__,this,expr,depth,root_expression);
    break;
  case BETWEEN:
    expr_05 = BaseExpression::Cast<duckdb::BetweenExpression>(this_00);
    BindExpression(__return_storage_ptr__,this,expr_05,depth);
    break;
  case LAMBDA_REF:
    lambda_ref = BaseExpression::Cast<duckdb::LambdaRefExpression>(this_00);
    BindExpression(__return_storage_ptr__,this,lambda_ref,depth);
  }
  *(_func_int **)(local_50._0_8_ + 0x30) = *(_func_int **)(local_50._0_8_ + 0x30) + -local_50._8_8_;
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindExpression(unique_ptr<ParsedExpression> &expr, idx_t depth, bool root_expression) {
	auto stack_checker = StackCheck(*expr);

	auto &expr_ref = *expr;
	switch (expr_ref.GetExpressionClass()) {
	case ExpressionClass::BETWEEN:
		return BindExpression(expr_ref.Cast<BetweenExpression>(), depth);
	case ExpressionClass::CASE:
		return BindExpression(expr_ref.Cast<CaseExpression>(), depth);
	case ExpressionClass::CAST:
		return BindExpression(expr_ref.Cast<CastExpression>(), depth);
	case ExpressionClass::COLLATE:
		return BindExpression(expr_ref.Cast<CollateExpression>(), depth);
	case ExpressionClass::COLUMN_REF:
		return BindExpression(expr_ref.Cast<ColumnRefExpression>(), depth, root_expression);
	case ExpressionClass::LAMBDA_REF:
		return BindExpression(expr_ref.Cast<LambdaRefExpression>(), depth);
	case ExpressionClass::COMPARISON:
		return BindExpression(expr_ref.Cast<ComparisonExpression>(), depth);
	case ExpressionClass::CONJUNCTION:
		return BindExpression(expr_ref.Cast<ConjunctionExpression>(), depth);
	case ExpressionClass::CONSTANT:
		return BindExpression(expr_ref.Cast<ConstantExpression>(), depth);
	case ExpressionClass::FUNCTION: {
		auto &function = expr_ref.Cast<FunctionExpression>();
		if (IsUnnestFunction(function.function_name)) {
			// special case, not in catalog
			return BindUnnest(function, depth, root_expression);
		}
		// binding a function expression requires an extra parameter for macros
		return BindExpression(function, depth, expr);
	}
	case ExpressionClass::LAMBDA:
		return BindExpression(expr_ref.Cast<LambdaExpression>(), depth, LogicalTypeId::INVALID, nullptr);
	case ExpressionClass::OPERATOR:
		return BindExpression(expr_ref.Cast<OperatorExpression>(), depth);
	case ExpressionClass::SUBQUERY:
		return BindExpression(expr_ref.Cast<SubqueryExpression>(), depth);
	case ExpressionClass::PARAMETER:
		return BindExpression(expr_ref.Cast<ParameterExpression>(), depth);
	case ExpressionClass::POSITIONAL_REFERENCE:
		return BindPositionalReference(expr, depth, root_expression);
	case ExpressionClass::STAR:
		return BindResult(BinderException::Unsupported(expr_ref, "STAR expression is not supported here"));
	default:
		throw NotImplementedException("Unimplemented expression class");
	}
}